

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor-read.c
# Opt level: O0

int read_uint32_array(coda_cursor_conflict *cursor,uint32_t *dst,coda_array_ordering array_ordering)

{
  coda_backend cVar1;
  int iVar2;
  coda_array_ordering array_ordering_local;
  uint32_t *dst_local;
  coda_cursor_conflict *cursor_local;
  
  cVar1 = (cursor->stack[cursor->n + -1].type)->backend;
  if (cVar1 == coda_backend_ascii) {
    cursor_local._4_4_ = coda_ascii_cursor_read_uint32_array(cursor,dst,array_ordering);
  }
  else if (cVar1 == coda_backend_binary) {
    cursor_local._4_4_ = coda_bin_cursor_read_uint32_array(cursor,dst,array_ordering);
  }
  else if (cVar1 == coda_backend_memory) {
    cursor_local._4_4_ = coda_mem_cursor_read_uint32_array(cursor,dst,array_ordering);
  }
  else if (cVar1 == coda_backend_hdf4) {
    coda_set_error(-0xb,(char *)0x0);
    cursor_local._4_4_ = -1;
  }
  else if (cVar1 == coda_backend_hdf5) {
    coda_set_error(-0xd,(char *)0x0);
    cursor_local._4_4_ = -1;
  }
  else {
    if (cVar1 == coda_backend_cdf) {
      iVar2 = coda_cdf_cursor_read_uint32_array(cursor,dst);
      if (iVar2 != 0) {
        return -1;
      }
    }
    else if (cVar1 - coda_backend_netcdf < 2) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor-read.c"
                    ,0x435,
                    "int read_uint32_array(const coda_cursor *, uint32_t *, coda_array_ordering)");
    }
    if (array_ordering == coda_array_ordering_c) {
      cursor_local._4_4_ = 0;
    }
    else {
      cursor_local._4_4_ = transpose_array(cursor,dst,4);
    }
  }
  return cursor_local._4_4_;
}

Assistant:

static int read_uint32_array(const coda_cursor *cursor, uint32_t *dst, coda_array_ordering array_ordering)
{
    switch (cursor->stack[cursor->n - 1].type->backend)
    {
        case coda_backend_ascii:
            return coda_ascii_cursor_read_uint32_array(cursor, dst, array_ordering);
        case coda_backend_binary:
            return coda_bin_cursor_read_uint32_array(cursor, dst, array_ordering);
        case coda_backend_memory:
            return coda_mem_cursor_read_uint32_array(cursor, dst, array_ordering);
        case coda_backend_hdf4:
#ifdef HAVE_HDF4
            if (coda_hdf4_cursor_read_uint32_array(cursor, dst) != 0)
            {
                return -1;
            }
            break;
#else
            coda_set_error(CODA_ERROR_NO_HDF4_SUPPORT, NULL);
            return -1;
#endif
        case coda_backend_hdf5:
#ifdef HAVE_HDF5
            if (coda_hdf5_cursor_read_uint32_array(cursor, dst) != 0)
            {
                return -1;
            }
            break;
#else
            coda_set_error(CODA_ERROR_NO_HDF5_SUPPORT, NULL);
            return -1;
#endif
        case coda_backend_cdf:
            if (coda_cdf_cursor_read_uint32_array(cursor, dst) != 0)
            {
                return -1;
            }
            break;
        case coda_backend_netcdf:
        case coda_backend_grib:
            assert(0);
            exit(1);
    }

    if (array_ordering != coda_array_ordering_c)
    {
        return transpose_array(cursor, dst, sizeof(uint32_t));
    }

    return 0;
}